

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_decode_memory
               (uchar **out,uint *w,uint *h,uchar *in,size_t insize,LodePNGColorType colortype,
               uint bitdepth)

{
  uint uVar1;
  undefined1 local_1e0 [8];
  LodePNGState state;
  uint error;
  LodePNGColorType colortype_local;
  size_t insize_local;
  uchar *in_local;
  uint *h_local;
  uint *w_local;
  uchar **out_local;
  
  state._420_4_ = colortype;
  LodePNGState::LodePNGState((LodePNGState *)local_1e0);
  lodepng_state_init((LodePNGState *)local_1e0);
  state.encoder.text_compression = state._420_4_;
  state.encoder._84_4_ = bitdepth;
  state.error = lodepng_decode(out,w,h,(LodePNGState *)local_1e0,in,insize);
  lodepng_state_cleanup((LodePNGState *)local_1e0);
  uVar1 = state.error;
  LodePNGState::~LodePNGState((LodePNGState *)local_1e0);
  return uVar1;
}

Assistant:

unsigned lodepng_decode_memory(unsigned char** out, unsigned* w, unsigned* h, const unsigned char* in,
                               size_t insize, LodePNGColorType colortype, unsigned bitdepth)
{
  unsigned error;
  LodePNGState state;
  lodepng_state_init(&state);
  state.info_raw.colortype = colortype;
  state.info_raw.bitdepth = bitdepth;
  error = lodepng_decode(out, w, h, &state, in, insize);
  lodepng_state_cleanup(&state);
  return error;
}